

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::setOrientation(ProgressBar *this,Orientation orientation)

{
  Orientation OVar1;
  ProgressBarPrivate *pPVar2;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_18;
  Orientation local_14;
  QSizePolicy sp;
  Orientation orientation_local;
  ProgressBar *this_local;
  
  local_14 = orientation;
  _sp = this;
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  OVar1 = local_14;
  if (pPVar2->orientation != local_14) {
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    pPVar2->orientation = OVar1;
    local_18.data = QWidget::sizePolicy();
    QSizePolicy::transpose((QSizePolicy *)&local_18.bits);
    QWidget::setSizePolicy((QSizePolicy *)this);
    QWidget::updateGeometry();
    QWidget::update();
  }
  return;
}

Assistant:

void
ProgressBar::setOrientation( Qt::Orientation orientation )
{
	if( d->orientation == orientation )
		return;

	d->orientation = orientation;

	QSizePolicy sp = sizePolicy();
	sp.transpose();
	setSizePolicy( sp );

	updateGeometry();
	update();
}